

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void updateCursorImage(_GLFWwindow *window)

{
  Cursor CVar1;
  Window WVar2;
  
  if (window->cursorMode == 0x34001) {
    WVar2 = (window->x11).handle;
    if (window->cursor == (_GLFWcursor *)0x0) {
      XUndefineCursor(_glfw.x11.display,WVar2);
      return;
    }
    CVar1 = (window->cursor->x11).handle;
  }
  else {
    WVar2 = (window->x11).handle;
    CVar1 = _glfw.x11.cursor;
  }
  XDefineCursor(_glfw.x11.display,WVar2,CVar1);
  return;
}

Assistant:

static void updateCursorImage(_GLFWwindow* window)
{
    if (window->cursorMode == GLFW_CURSOR_NORMAL)
    {
        if (window->cursor)
        {
            XDefineCursor(_glfw.x11.display, window->x11.handle,
                          window->cursor->x11.handle);
        }
        else
            XUndefineCursor(_glfw.x11.display, window->x11.handle);
    }
    else
        XDefineCursor(_glfw.x11.display, window->x11.handle, _glfw.x11.cursor);
}